

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O3

void duckdb::WriteDataToVarcharSegment
               (ListSegmentFunctions *functions,ArenaAllocator *allocator,ListSegment *segment,
               RecursiveUnifiedVectorFormat *input_data,idx_t *entry_idx)

{
  idx_t *piVar1;
  long *plVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  const_reference functions_00;
  ListSegment *pLVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ushort uVar9;
  ulong uVar10;
  bool bVar11;
  LinkedList child_segments;
  LinkedList local_68;
  ListSegment *local_48;
  uint16_t *local_40;
  data_ptr_t local_38;
  
  uVar6 = *entry_idx;
  psVar3 = ((input_data->unified).sel)->sel_vector;
  if (psVar3 != (sel_t *)0x0) {
    uVar6 = (ulong)psVar3[uVar6];
  }
  local_48 = segment + 1;
  puVar4 = (input_data->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar4 == (unsigned_long *)0x0) {
    uVar10 = (ulong)segment->count;
    *(undefined1 *)((long)&segment[1].count + uVar10) = 0;
    uVar9 = segment->capacity;
    uVar8 = (ulong)uVar9;
  }
  else {
    bVar11 = (puVar4[uVar6 >> 6] & 1L << ((byte)uVar6 & 0x3f)) == 0;
    uVar10 = (ulong)segment->count;
    *(bool *)((long)&segment[1].count + uVar10) = bVar11;
    uVar9 = segment->capacity;
    uVar8 = (ulong)uVar9;
    if (bVar11) {
      *(undefined8 *)((long)&local_48->count + uVar10 * 8 + uVar8) = 0;
      return;
    }
  }
  local_40 = &segment->capacity;
  local_38 = (input_data->unified).data;
  lVar7 = uVar6 * 0x10;
  uVar6 = (ulong)*(uint *)(local_38 + lVar7);
  if (uVar6 < 0xd) {
    local_38 = local_38 + lVar7 + 4;
  }
  else {
    local_38 = *(data_ptr_t *)(local_38 + lVar7 + 8);
  }
  *(ulong *)((long)&local_48->count + uVar10 * 8 + uVar8) = uVar6;
  local_68.last_segment = *(ListSegment **)((long)&segment[2].count + uVar8 * 9);
  piVar1 = (idx_t *)((long)&local_48->count + uVar8 * 9);
  local_68.total_capacity = *piVar1;
  local_68.first_segment = (ListSegment *)piVar1[1];
  if (uVar6 != 0) {
    uVar10 = 0;
    do {
      functions_00 = vector<duckdb::ListSegmentFunctions,_true>::back(&functions->child_functions);
      pLVar5 = GetSegment(functions_00,allocator,&local_68);
      uVar8 = (ulong)pLVar5->capacity - (ulong)pLVar5->count;
      if (uVar6 - uVar10 < uVar8) {
        uVar8 = uVar6 - uVar10;
      }
      switchD_012bc561::default
                ((void *)((long)&pLVar5[1].count + (ulong)pLVar5->count),local_38 + uVar10,uVar8);
      uVar10 = uVar10 + uVar8;
      pLVar5->count = pLVar5->count + (short)uVar8;
    } while (uVar10 < uVar6);
    uVar9 = *local_40;
  }
  *(ListSegment **)((long)&local_48[1].count + (ulong)uVar9 * 9) = local_68.last_segment;
  plVar2 = (long *)((long)&local_48->count + (ulong)uVar9 * 9);
  *plVar2 = local_68.total_capacity + uVar6;
  plVar2[1] = (long)local_68.first_segment;
  return;
}

Assistant:

static void WriteDataToVarcharSegment(const ListSegmentFunctions &functions, ArenaAllocator &allocator,
                                      ListSegment *segment, RecursiveUnifiedVectorFormat &input_data,
                                      idx_t &entry_idx) {

	auto sel_entry_idx = input_data.unified.sel->get_index(entry_idx);

	// write null validity
	auto null_mask = GetNullMask(segment);
	auto valid = input_data.unified.validity.RowIsValid(sel_entry_idx);
	null_mask[segment->count] = !valid;

	// set the length of this string
	auto str_length_data = GetListLengthData(segment);

	// we can reconstruct the offset from the length
	if (!valid) {
		Store<uint64_t>(0, data_ptr_cast(str_length_data + segment->count));
		return;
	}
	auto &str_entry = UnifiedVectorFormat::GetData<string_t>(input_data.unified)[sel_entry_idx];
	auto str_data = str_entry.GetData();
	idx_t str_size = str_entry.GetSize();
	Store<uint64_t>(str_size, data_ptr_cast(str_length_data + segment->count));

	// write the characters to the linked list of child segments
	auto child_segments = Load<LinkedList>(data_ptr_cast(GetListChildData(segment)));
	idx_t current_offset = 0;
	while (current_offset < str_size) {
		auto child_segment = GetSegment(functions.child_functions.back(), allocator, child_segments);
		auto data = GetStringData(child_segment);
		idx_t copy_count = MinValue<idx_t>(str_size - current_offset, child_segment->capacity - child_segment->count);
		memcpy(data + child_segment->count, str_data + current_offset, copy_count);
		current_offset += copy_count;
		child_segment->count += copy_count;
	}
	child_segments.total_capacity += str_size;
	// store the updated linked list
	Store<LinkedList>(child_segments, data_ptr_cast(GetListChildData(segment)));
}